

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

void __thiscall Node::~Node(Node *this)

{
  this->_vptr_Node = (_func_int **)&PTR__Node_00125a60;
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::_M_erase(&(this->successors_)._M_t,
             (_Link_type)(this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::_M_erase(&(this->predecessors_)._M_t,
             (_Link_type)
             (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  operator_delete(this,0x80);
  return;
}

Assistant:

virtual ~Node() = default;